

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSparsityPatternLearner.h
# Opt level: O1

void __thiscall chrono::ChSparsityPatternLearner::process(ChSparsityPatternLearner *this)

{
  pointer piVar1;
  size_t *psVar2;
  long lVar3;
  pointer plVar4;
  long lVar5;
  pointer plVar6;
  
  plVar4 = (this->innerVectors).
           super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (plVar6 = (this->innerVectors).
                super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; plVar6 != plVar4; plVar6 = plVar6 + 1) {
    std::__cxx11::list<int,_std::allocator<int>_>::sort(plVar6);
    std::__cxx11::list<int,_std::allocator<int>_>::unique(plVar6);
    plVar4 = (this->innerVectors).
             super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (&this->innerVectors_size,
             ((long)plVar4 -
              (long)(this->innerVectors).
                    super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  plVar6 = (this->innerVectors).
           super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->innerVectors).
                super__Vector_base<std::__cxx11::list<int,_std::allocator<int>_>,_std::allocator<std::__cxx11::list<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)plVar6;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 3) * -0x5555555555555555;
    piVar1 = (this->innerVectors_size).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    psVar2 = (size_t *)
             ((long)&(plVar6->super__List_base<int,_std::allocator<int>_>)._M_impl._M_node + 0x10);
    lVar5 = 0;
    do {
      piVar1[lVar5] = (int)*psVar2;
      lVar5 = lVar5 + 1;
      psVar2 = psVar2 + 3;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar5);
  }
  this->processed = true;
  return;
}

Assistant:

void process() {
        // Find the unique indices of non-zero elements in each inner vector
        for (auto vec = innerVectors.begin(); vec != innerVectors.end(); ++vec) {
            vec->sort();
            vec->unique();
        }

        // Cache the number of non-zero elements in each inner vector
        // (in each row if RowMajor, in each column if ColMajor)
        innerVectors_size.resize(innerVectors.size());
        for (auto i = 0; i < innerVectors.size(); ++i) {
            innerVectors_size[i] = static_cast<int>(innerVectors[i].size());
        }

        processed = true;
    }